

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QScreen * __thiscall QWidget::screen(QWidget *this)

{
  QWidgetPrivate *this_00;
  tuple<QTLWExtra_*,_std::default_delete<QTLWExtra>_> tVar1;
  QWidgetData *pQVar2;
  QScreen *pQVar3;
  long lVar4;
  long lVar5;
  QWidget *pQVar6;
  long in_FS_OFFSET;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QWidgetPrivate::associatedScreen(*(QWidgetPrivate **)&this->field_0x8);
  if (pQVar3 == (QScreen *)0x0) {
    do {
      pQVar6 = this;
      this_00 = *(QWidgetPrivate **)&pQVar6->field_0x8;
      if (*(QWidget **)&this_00->field_0x10 == (QWidget *)0x0) break;
      this = *(QWidget **)&this_00->field_0x10;
    } while (((pQVar6->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
    QWidgetPrivate::createTLExtra(this_00);
    tVar1.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
    super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> *)
          &(((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
             _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
           super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
    if ((((tVar1.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
           super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl ==
           (_Head_base<0UL,_QTLWExtra_*,_false>)0x0) ||
         (lVar4 = *(long *)((long)tVar1.
                                  super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>
                                  .super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8),
         lVar4 == 0)) || (*(int *)(lVar4 + 4) == 0)) ||
       (*(QScreen **)
         ((long)tVar1.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xc0) == (QScreen *)0x0)) {
      pQVar2 = pQVar6->data;
      lVar5 = (long)(pQVar2->crect).x2.m_i + (long)(pQVar2->crect).x1.m_i;
      lVar4 = (long)(pQVar2->crect).y2.m_i + (long)(pQVar2->crect).y1.m_i;
      local_28 = (QPoint)((ulong)(lVar5 - (lVar5 >> 0x3f)) >> 1 & 0xffffffff |
                         (lVar4 - (lVar4 >> 0x3f) & 0xfffffffffffffffeU) << 0x1f);
      pQVar3 = (QScreen *)QGuiApplication::screenAt(&local_28);
      if (pQVar3 == (QScreen *)0x0) {
        pQVar3 = (QScreen *)QGuiApplication::primaryScreen();
      }
    }
    else {
      pQVar3 = *(QScreen **)
                ((long)tVar1.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xc0);
      if (*(int *)(lVar4 + 4) == 0) {
        pQVar3 = (QScreen *)0x0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QScreen *QWidget::screen() const
{
    Q_D(const QWidget);
    if (auto associatedScreen = d->associatedScreen())
        return associatedScreen;
    if (auto topLevel = window()) {
        if (auto topData = qt_widget_private(topLevel)->topData()) {
            if (topData->initialScreen)
                return topData->initialScreen;
        }
        if (auto screenByPos = QGuiApplication::screenAt(topLevel->geometry().center()))
            return screenByPos;
    }
    return QGuiApplication::primaryScreen();
}